

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O3

bool __thiscall rsg::VariableType::operator!=(VariableType *this,VariableType *other)

{
  VariableType *this_00;
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  pointer other_00;
  pointer this_01;
  
  bVar3 = true;
  if (((this->m_baseType == other->m_baseType) && (this->m_precision == other->m_precision)) &&
     (this->m_numElements == other->m_numElements)) {
    this_00 = this->m_elementType;
    if (((this_00 != (VariableType *)0x0) != (other->m_elementType == (VariableType *)0x0)) &&
       ((this_00 == (VariableType *)0x0 ||
        (bVar2 = operator!=(this_00,other->m_elementType), !bVar2)))) {
      this_01 = (this->m_members).
                super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar1 = (this->m_members).
               super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      other_00 = (other->m_members).
                 super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pMVar1 - (long)this_01 ==
          (long)(other->m_members).
                super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)other_00) {
        if (this_01 == pMVar1) {
          bVar3 = false;
        }
        else {
          do {
            bVar3 = Member::operator!=(this_01,other_00);
            if (bVar3) {
              return bVar3;
            }
            this_01 = this_01 + 1;
            other_00 = other_00 + 1;
          } while (this_01 != pMVar1);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool VariableType::operator!= (const VariableType& other) const
{
	if (m_baseType != other.m_baseType)
		return true;
	if (m_precision != other.m_precision)
		return true;
	if (m_numElements != other.m_numElements)
		return true;
	if (!!m_elementType != !!other.m_elementType)
		return true;
	if (m_elementType && *m_elementType != *other.m_elementType)
		return true;
	if (m_members != other.m_members)
		return true;
	return false;
}